

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

_Bool ecs_filter_next(ecs_iter_t *it)

{
  ecs_sparse_t *sparse;
  _Bool _Var1;
  int32_t iVar2;
  ecs_table_t *table;
  ecs_data_t *peVar3;
  ecs_entity_t *peVar4;
  bool bVar5;
  int dense_index;
  
  sparse = (it->iter).filter.tables;
  iVar2 = ecs_sparse_count(sparse);
  dense_index = (it->iter).parent.index;
  if (dense_index < iVar2) {
    bVar5 = true;
    do {
      table = (ecs_table_t *)_ecs_sparse_get(sparse,0x80,dense_index);
      _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/filter.c"
                  ,0x1e);
      if (table == (ecs_table_t *)0x0) {
        __assert_fail("table != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/filter.c"
                      ,0x1e,"_Bool ecs_filter_next(ecs_iter_t *)");
      }
      peVar3 = ecs_table_get_data(table);
      if ((peVar3 != (ecs_data_t *)0x0) &&
         (_Var1 = ecs_table_match_filter(it->world,table,&(it->iter).parent.filter), _Var1)) {
        (it->iter).parent.table.table = table;
        it->table = (ecs_iter_table_t *)((long)&it->iter + 0x28);
        it->table_columns = peVar3->columns;
        iVar2 = ecs_table_count(table);
        it->count = iVar2;
        peVar4 = (ecs_entity_t *)_ecs_vector_first(peVar3->entities,8,0x10);
        it->entities = peVar4;
        (it->iter).parent.index = dense_index + 1;
        return bVar5;
      }
      dense_index = dense_index + 1;
      bVar5 = dense_index < iVar2;
    } while (dense_index != iVar2);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ecs_filter_next(
    ecs_iter_t *it)
{
    ecs_filter_iter_t *iter = &it->iter.filter;
    ecs_sparse_t *tables = iter->tables;
    int32_t count = ecs_sparse_count(tables);
    int32_t i;

    for (i = iter->index; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(tables, ecs_table_t, i);
        ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
        
        ecs_data_t *data = ecs_table_get_data(table);

        if (!data) {
            continue;
        }

        if (!ecs_table_match_filter(it->world, table, &iter->filter)) {
            continue;
        }

        iter->table.table = table;
        it->table = &iter->table;
        it->table_columns = data->columns;
        it->count = ecs_table_count(table);
        it->entities = ecs_vector_first(data->entities, ecs_entity_t);
        iter->index = i + 1;

        return true;
    }

    return false;
}